

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void applyNumericAffinity(Mem *pRec,int bTryForInt)

{
  int iVar1;
  int rc;
  u8 enc;
  double rValue;
  Mem *pMStack_10;
  int bTryForInt_local;
  Mem *pRec_local;
  
  rValue._4_4_ = bTryForInt;
  pMStack_10 = pRec;
  iVar1 = sqlite3AtoF(pRec->z,(double *)&rc,pRec->n,pRec->enc);
  if (0 < iVar1) {
    if ((iVar1 == 1) && (iVar1 = alsoAnInt(pMStack_10,_rc,(i64 *)pMStack_10), iVar1 != 0)) {
      pMStack_10->flags = pMStack_10->flags | 4;
    }
    else {
      (pMStack_10->u).r = _rc;
      pMStack_10->flags = pMStack_10->flags | 8;
      if (rValue._4_4_ != 0) {
        sqlite3VdbeIntegerAffinity(pMStack_10);
      }
    }
    pMStack_10->flags = pMStack_10->flags & 0xfffd;
  }
  return;
}

Assistant:

static void applyNumericAffinity(Mem *pRec, int bTryForInt){
  double rValue;
  u8 enc = pRec->enc;
  int rc;
  assert( (pRec->flags & (MEM_Str|MEM_Int|MEM_Real|MEM_IntReal))==MEM_Str );
  rc = sqlite3AtoF(pRec->z, &rValue, pRec->n, enc);
  if( rc<=0 ) return;
  if( rc==1 && alsoAnInt(pRec, rValue, &pRec->u.i) ){
    pRec->flags |= MEM_Int;
  }else{
    pRec->u.r = rValue;
    pRec->flags |= MEM_Real;
    if( bTryForInt ) sqlite3VdbeIntegerAffinity(pRec);
  }
  /* TEXT->NUMERIC is many->one.  Hence, it is important to invalidate the
  ** string representation after computing a numeric equivalent, because the
  ** string representation might not be the canonical representation for the
  ** numeric value.  Ticket [343634942dd54ab57b7024] 2018-01-31. */
  pRec->flags &= ~MEM_Str;
}